

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

char16 * Js::JavascriptLibrary::GetStringTemplateCallsiteObjectKey(Var callsite)

{
  uint uVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  ES5Array *instance;
  JavascriptArray *this;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  Recycler *this_00;
  char16_t *dst;
  char16 *pcVar7;
  int iVar8;
  char16_t *dst_00;
  uint32 i;
  uint32 index;
  uint uVar9;
  ulong count;
  uint32 i_1;
  uint index_00;
  undefined1 local_88 [8];
  TrackAllocData data;
  Var local_38;
  Var var;
  
  instance = VarTo<Js::ES5Array>(callsite);
  scriptContext =
       (((((instance->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_38 = JavascriptOperators::OP_GetProperty(instance,0x12a,scriptContext);
  this = &VarTo<Js::ES5Array>(local_38)->super_JavascriptArray;
  uVar1 = (this->super_ArrayObject).length;
  if (uVar1 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x16c7,"(arrayLength != 0)","arrayLength != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  iVar8 = 0;
  for (index = 0; uVar1 != index; index = index + 1) {
    JavascriptArray::DirectGetItemAt<void*>(this,index,&local_38);
    pJVar6 = VarTo<Js::JavascriptString>(local_38);
    cVar4 = JavascriptString::GetLength(pJVar6);
    iVar8 = iVar8 + cVar4;
  }
  uVar9 = iVar8 + -2 + uVar1 * 3;
  count = (ulong)uVar9;
  local_88 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x16d2;
  data.plusSize = count;
  this_00 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_88);
  dst = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                  ((Memory *)this_00,(Recycler *)Memory::Recycler::Alloc,0,count);
  JavascriptArray::DirectGetItemAt<void*>(this,0,&local_38);
  pJVar6 = VarTo<Js::JavascriptString>(local_38);
  cVar4 = JavascriptString::GetLength(pJVar6);
  pcVar7 = JavascriptString::GetString(pJVar6);
  js_wmemcpy_s(dst,count,pcVar7,(ulong)cVar4);
  dst_00 = dst + cVar4;
  uVar9 = uVar9 - cVar4;
  for (index_00 = 1; index_00 < uVar1; index_00 = index_00 + 1) {
    js_wmemcpy_s(dst_00,(ulong)uVar9,L"${}",3);
    data._32_8_ = dst_00 + 3;
    JavascriptArray::DirectGetItemAt<void*>(this,index_00,&local_38);
    pJVar6 = VarTo<Js::JavascriptString>(local_38);
    cVar4 = JavascriptString::GetLength(pJVar6);
    pcVar7 = JavascriptString::GetString(pJVar6);
    js_wmemcpy_s((char16 *)data._32_8_,(ulong)(uVar9 - 3),pcVar7,(ulong)cVar4);
    dst_00 = dst_00 + (ulong)cVar4 + 3;
    uVar9 = (uVar9 - 3) - cVar4;
  }
  dst[(iVar8 + uVar1 * 3) - 3] = L'\0';
  return dst;
}

Assistant:

const char16* JavascriptLibrary::GetStringTemplateCallsiteObjectKey(Var callsite)
    {
        // Calculate the key for the string template callsite object.
        // Key is combination of the raw string literals delimited by '${}' since string template literals cannot include that symbol.
        // `str1${expr1}str2${expr2}str3` => "str1${}str2${}str3"

        ES5Array* callsiteObj = VarTo<ES5Array>(callsite);
        ScriptContext* scriptContext = callsiteObj->GetScriptContext();

        Var var = JavascriptOperators::OP_GetProperty(callsiteObj, Js::PropertyIds::raw, scriptContext);
        ES5Array* rawArray = VarTo<ES5Array>(var);
        uint32 arrayLength = rawArray->GetLength();
        uint32 totalStringLength = 0;
        JavascriptString* str;

        Assert(arrayLength != 0);

        // Count the size in characters of the raw strings
        for (uint32 i = 0; i < arrayLength; i++)
        {
            rawArray->DirectGetItemAt(i, &var);
            str = VarTo<JavascriptString>(var);
            totalStringLength += str->GetLength();
        }

        uint32 keyLength = totalStringLength + (arrayLength - 1) * 3 + 1;
        char16* key = RecyclerNewArray(scriptContext->GetRecycler(), char16, keyLength);
        char16* ptr = key;
        charcount_t remainingSpace = keyLength;

        // Get first item before loop - there always must be at least one item
        rawArray->DirectGetItemAt(0, &var);
        str = VarTo<JavascriptString>(var);

        charcount_t len = str->GetLength();
        js_wmemcpy_s(ptr, remainingSpace, str->GetString(), len);
        ptr += len;
        remainingSpace -= len;

        // Append a delimiter and the rest of the items
        for (uint32 i = 1; i < arrayLength; i++)
        {
            len = 3; // strlen(_u("${}"));
            js_wmemcpy_s(ptr, remainingSpace, _u("${}"), len);
            ptr += len;
            remainingSpace -= len;

            rawArray->DirectGetItemAt(i, &var);
            str = VarTo<JavascriptString>(var);

            len = str->GetLength();
            js_wmemcpy_s(ptr, remainingSpace, str->GetString(), len);
            ptr += len;
            remainingSpace -= len;
        }

        // Ensure string is terminated
        key[keyLength - 1] = _u('\0');

        return key;
    }